

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.h
# Opt level: O1

void __thiscall
Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::MarshalCrossSite_TTDInflate
          (FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (*(long *)&(this->super_ScriptFunctionWithInlineCache).super_ScriptFunction.
                super_ScriptFunctionBase.super_JavascriptFunction.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject !=
      VirtualTableInfo<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ScriptFunction.h"
                                ,0x36,
                                "(VirtualTableInfo<FunctionWithHomeObj<BaseClass>>::HasVirtualTable(this))"
                                ,"Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_ScriptFunctionWithInlineCache).super_ScriptFunction.super_ScriptFunctionBase.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>_>
       ::Address;
  return;
}

Assistant:

FunctionWithHomeObj(FunctionProxy* proxy, ScriptFunctionType* deferredPrototypeType)
            : BaseClass(proxy, deferredPrototypeType), homeObj(nullptr)
        {
            Assert(proxy->GetFunctionInfo()->HasHomeObj());
        }